

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

void fits_setup_shape(RgnShape *newShape)

{
  shapeType sVar1;
  undefined1 auVar2 [16];
  anon_union_120_2_131c4ffb_for_param *paVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  anon_union_120_2_131c4ffb_for_param *paVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (newShape->shape == poly_rgn) {
    paVar7 = (anon_union_120_2_131c4ffb_for_param *)(newShape->param).poly.Pts;
  }
  else {
    paVar7 = &newShape->param;
  }
  switch(newShape->shape) {
  case line_rgn:
    auVar19._0_8_ = (paVar7->gen).p[2] - (paVar7->gen).p[0];
    auVar19._8_8_ = (paVar7->gen).p[3] - (paVar7->gen).p[1];
    dVar10 = auVar19._0_8_ * auVar19._0_8_ + auVar19._8_8_ * auVar19._8_8_;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    uVar4 = -(uint)(dVar10 != 0.0) & 1;
    auVar12._8_8_ = dVar10;
    auVar12._0_8_ = dVar10;
    auVar20 = divpd(auVar19,auVar12);
    auVar13._0_8_ = CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,(int)(uVar4 << 0x1f) >> 0x1f);
    auVar13._8_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    auVar13._12_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
    auVar21._0_8_ = auVar20._0_8_ & auVar13._0_8_;
    auVar21._8_8_ = auVar20._8_8_ & auVar13._8_8_;
    auVar14._0_8_ = ~auVar13._0_8_ & 0x3ff0000000000000;
    auVar14._8_8_ = 0;
    auVar14 = auVar14 | auVar21;
    auVar15._0_8_ = auVar14._8_8_;
    auVar15._8_4_ = auVar14._0_4_;
    auVar15._12_4_ = auVar14._4_4_;
    *(undefined1 (*) [16])((long)&newShape->param + 0x58) = auVar15;
    dVar10 = dVar10 + 0.5;
    goto LAB_001b37fa;
  case circle_rgn:
    dVar10 = (paVar7->gen).p[2] * (paVar7->gen).p[2];
LAB_001b37fa:
    (newShape->param).gen.a = dVar10;
    break;
  case annulus_rgn:
    (newShape->param).gen.a = (paVar7->gen).p[2] * (paVar7->gen).p[2];
    (newShape->param).gen.b = (paVar7->gen).p[3] * (paVar7->gen).p[3];
    break;
  case ellipse_rgn:
  case box_rgn:
  case diamond_rgn:
    dVar10 = sin(((paVar7->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar10;
    uVar8 = SUB84(*(double *)((long)paVar7 + 0x20),0);
    uVar9 = (undefined4)((ulong)*(double *)((long)paVar7 + 0x20) >> 0x20);
    goto LAB_001b34ae;
  case elliptannulus_rgn:
  case boxannulus_rgn:
    dVar10 = sin(((paVar7->gen).p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.a = dVar10;
    dVar10 = cos(((paVar7->gen).p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.b = dVar10;
    dVar10 = sin(((paVar7->gen).p[7] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar10;
    uVar8 = SUB84(*(double *)((long)paVar7 + 0x38),0);
    uVar9 = (undefined4)((ulong)*(double *)((long)paVar7 + 0x38) >> 0x20);
    goto LAB_001b34ae;
  case rectangle_rgn:
    dVar10 = sin(((paVar7->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar10;
    dVar11 = cos(((paVar7->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar11;
    dVar16 = ((paVar7->gen).p[2] - (paVar7->gen).p[0]) * 0.5;
    dVar17 = ((paVar7->gen).p[3] - (paVar7->gen).p[1]) * 0.5;
    dVar10 = (newShape->param).gen.sinT;
    dVar18 = ABS(dVar11 * dVar17 + -dVar16 * dVar10);
    auVar2._8_4_ = SUB84(dVar18,0);
    auVar2._0_8_ = ABS(dVar11 * dVar16 + dVar17 * dVar10);
    auVar2._12_4_ = (int)((ulong)dVar18 >> 0x20);
    *(undefined1 (*) [16])((long)&newShape->param + 0x68) = auVar2;
    (newShape->param).gen.p[5] = ((paVar7->gen).p[2] + (paVar7->gen).p[0]) * 0.5;
    (newShape->param).gen.p[6] = ((paVar7->gen).p[3] + (paVar7->gen).p[1]) * 0.5;
    break;
  case sector_rgn:
    dVar10 = (paVar7->gen).p[2];
    if (180.0 < dVar10) {
      do {
        dVar10 = dVar10 + -360.0;
      } while (180.0 < dVar10);
      (paVar7->gen).p[2] = dVar10;
    }
    dVar10 = (paVar7->gen).p[2];
    if (dVar10 <= -180.0) {
      do {
        dVar10 = dVar10 + 360.0;
      } while (dVar10 <= -180.0);
      (paVar7->gen).p[2] = dVar10;
    }
    dVar10 = (paVar7->gen).p[3];
    if (180.0 < dVar10) {
      do {
        dVar10 = dVar10 + -360.0;
      } while (180.0 < dVar10);
      (paVar7->gen).p[3] = dVar10;
    }
    dVar10 = (paVar7->gen).p[3];
    if (dVar10 <= -180.0) {
      do {
        dVar10 = dVar10 + 360.0;
      } while (dVar10 <= -180.0);
      (paVar7->gen).p[3] = dVar10;
    }
    break;
  case panda_rgn:
    dVar10 = (paVar7->gen).p[2];
    if (180.0 < dVar10) {
      do {
        dVar10 = dVar10 + -360.0;
      } while (180.0 < dVar10);
      (paVar7->gen).p[2] = dVar10;
    }
    dVar10 = (paVar7->gen).p[2];
    if (dVar10 <= -180.0) {
      do {
        dVar10 = dVar10 + 360.0;
      } while (dVar10 <= -180.0);
      (paVar7->gen).p[2] = dVar10;
    }
    dVar10 = (paVar7->gen).p[3];
    if (180.0 < dVar10) {
      do {
        dVar10 = dVar10 + -360.0;
      } while (180.0 < dVar10);
      (paVar7->gen).p[3] = dVar10;
    }
    dVar10 = (paVar7->gen).p[3];
    if (dVar10 <= -180.0) {
      do {
        dVar10 = dVar10 + 360.0;
      } while (dVar10 <= -180.0);
      (paVar7->gen).p[3] = dVar10;
    }
    dVar11 = (newShape->param).gen.p[5];
    dVar10 = (newShape->param).gen.p[6];
    dVar10 = dVar10 * dVar10;
    auVar20._8_4_ = SUB84(dVar10,0);
    auVar20._0_8_ = dVar11 * dVar11;
    auVar20._12_4_ = (int)((ulong)dVar10 >> 0x20);
    *(undefined1 (*) [16])((long)&newShape->param + 0x68) = auVar20;
    break;
  case epanda_rgn:
  case bpanda_rgn:
    dVar10 = (paVar7->gen).p[2];
    if (180.0 < dVar10) {
      do {
        dVar10 = dVar10 + -360.0;
      } while (180.0 < dVar10);
      (paVar7->gen).p[2] = dVar10;
    }
    dVar10 = (paVar7->gen).p[2];
    if (dVar10 <= -180.0) {
      do {
        dVar10 = dVar10 + 360.0;
      } while (dVar10 <= -180.0);
      (paVar7->gen).p[2] = dVar10;
    }
    dVar10 = (paVar7->gen).p[3];
    if (180.0 < dVar10) {
      do {
        dVar10 = dVar10 + -360.0;
      } while (180.0 < dVar10);
      (paVar7->gen).p[3] = dVar10;
    }
    dVar10 = (paVar7->gen).p[3];
    if (dVar10 <= -180.0) {
      do {
        dVar10 = dVar10 + 360.0;
      } while (dVar10 <= -180.0);
      (paVar7->gen).p[3] = dVar10;
    }
    dVar10 = sin(((paVar7->gen).p[10] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar10;
    uVar8 = SUB84(*(double *)((long)paVar7 + 0x50),0);
    uVar9 = (undefined4)((ulong)*(double *)((long)paVar7 + 0x50) >> 0x20);
LAB_001b34ae:
    dVar10 = cos(((double)CONCAT44(uVar9,uVar8) / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar10;
  }
  dVar10 = -1.0;
  switch(newShape->shape) {
  case point_rgn:
    dVar10 = 1.0;
    break;
  case circle_rgn:
    dVar10 = (paVar7->gen).p[2];
    break;
  case annulus_rgn:
    dVar10 = (paVar7->gen).p[3];
    break;
  case ellipse_rgn:
    dVar10 = *(double *)((long)paVar7 + 0x10);
    uVar8 = SUB84(dVar10,0);
    uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
    dVar11 = *(double *)((long)paVar7 + 0x18);
    if (dVar10 <= dVar11) {
      uVar8 = SUB84(dVar11,0);
      uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
    }
    dVar10 = (double)CONCAT44(uVar9,uVar8);
    break;
  case elliptannulus_rgn:
    dVar10 = *(double *)((long)paVar7 + 0x20);
    uVar8 = SUB84(dVar10,0);
    uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
    dVar11 = *(double *)((long)paVar7 + 0x28);
    if (dVar10 <= dVar11) {
      uVar8 = SUB84(dVar11,0);
      uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
    }
    dVar10 = (double)CONCAT44(uVar9,uVar8);
    break;
  case box_rgn:
    dVar10 = (paVar7->gen).p[2] * (paVar7->gen).p[2] + (paVar7->gen).p[3] * (paVar7->gen).p[3];
    goto LAB_001b389b;
  case boxannulus_rgn:
    dVar10 = (paVar7->gen).p[4] * (paVar7->gen).p[5];
    goto LAB_001b3897;
  case diamond_rgn:
    dVar10 = (paVar7->gen).p[2];
    if (dVar10 <= (paVar7->gen).p[3]) {
      dVar10 = (paVar7->gen).p[3] * 0.5;
      break;
    }
    goto LAB_001b38c4;
  case panda_rgn:
    dVar10 = (paVar7->gen).p[6];
    break;
  case epanda_rgn:
    dVar10 = *(double *)((long)paVar7 + 0x38);
    uVar8 = SUB84(dVar10,0);
    uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
    dVar11 = *(double *)((long)paVar7 + 0x40);
    if (dVar10 <= dVar11) {
      uVar8 = SUB84(dVar11,0);
      uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
    }
    dVar10 = (double)CONCAT44(uVar9,uVar8);
    break;
  case bpanda_rgn:
    dVar10 = (paVar7->gen).p[7] * (paVar7->gen).p[8];
LAB_001b3897:
    dVar10 = dVar10 + dVar10;
LAB_001b389b:
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
LAB_001b38c4:
    dVar10 = dVar10 * 0.5;
  }
  if (dVar10 <= 0.0) {
    sVar1 = newShape->shape;
    if ((int)sVar1 < 10) {
      if (sVar1 == line_rgn) {
        dVar10 = (paVar7->gen).p[2];
        paVar3 = paVar7;
        if ((paVar7->gen).p[0] <= dVar10) {
          dVar10 = (paVar7->gen).p[0];
          paVar3 = (anon_union_120_2_131c4ffb_for_param *)((paVar7->gen).p + 2);
        }
        newShape->xmin = dVar10;
        newShape->xmax = (paVar3->gen).p[0];
        if ((paVar7->gen).p[1] <= (paVar7->gen).p[3]) {
          newShape->ymin = (paVar7->gen).p[1];
          dVar10 = (paVar7->gen).p[3];
        }
        else {
          newShape->ymin = (paVar7->gen).p[3];
          dVar10 = (paVar7->gen).p[1];
        }
      }
      else {
        if (sVar1 != rectangle_rgn) {
          return;
        }
        dVar10 = (paVar7->gen).p[5] - (paVar7->gen).p[0];
        dVar11 = (paVar7->gen).p[6] - (paVar7->gen).p[1];
        dVar10 = dVar10 * dVar10 + dVar11 * dVar11;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        newShape->xmin = (paVar7->gen).p[5] - dVar10;
        newShape->xmax = (paVar7->gen).p[5] + dVar10;
        newShape->ymin = (paVar7->gen).p[6] - dVar10;
        dVar10 = dVar10 + (paVar7->gen).p[6];
      }
    }
    else {
      if (sVar1 != sector_rgn) {
        if (sVar1 != poly_rgn) {
          return;
        }
        newShape->xmin = (paVar7->gen).p[0];
        newShape->xmax = (paVar7->gen).p[0];
        newShape->ymin = (paVar7->gen).p[1];
        newShape->ymax = (paVar7->gen).p[1];
        uVar5 = (ulong)(newShape->param).poly.nPts;
        if ((long)uVar5 < 3) {
          return;
        }
        uVar8 = SUB84(newShape->xmin,0);
        uVar9 = (undefined4)((ulong)newShape->xmin >> 0x20);
        dVar10 = newShape->xmax;
        dVar11 = newShape->ymin;
        dVar18 = newShape->ymax;
        uVar6 = 2;
        do {
          dVar16 = *(double *)((long)paVar7 + uVar6 * 8);
          if (dVar16 <= (double)CONCAT44(uVar9,uVar8) && (double)CONCAT44(uVar9,uVar8) != dVar16) {
            newShape->xmin = dVar16;
            uVar8 = SUB84(dVar16,0);
            uVar9 = (undefined4)((ulong)dVar16 >> 0x20);
          }
          dVar16 = *(double *)((long)paVar7 + uVar6 * 8);
          if (dVar10 < dVar16) {
            newShape->xmax = dVar16;
            dVar10 = dVar16;
          }
          dVar16 = *(double *)((long)paVar7 + uVar6 * 8 + 8);
          if (dVar16 < dVar11) {
            newShape->ymin = dVar16;
            dVar11 = dVar16;
          }
          dVar16 = *(double *)((long)paVar7 + uVar6 * 8 + 8);
          if (dVar18 < dVar16) {
            newShape->ymax = dVar16;
            dVar18 = dVar16;
          }
          uVar6 = uVar6 + 2;
        } while (uVar6 < uVar5);
        return;
      }
      newShape->xmin = 1.0;
      newShape->xmax = -1.0;
      newShape->ymin = 1.0;
      dVar10 = -1.0;
    }
  }
  else {
    newShape->xmin = (paVar7->gen).p[0] - dVar10;
    newShape->xmax = (paVar7->gen).p[0] + dVar10;
    newShape->ymin = (paVar7->gen).p[1] - dVar10;
    dVar10 = dVar10 + (paVar7->gen).p[1];
  }
  newShape->ymax = dVar10;
  return;
}

Assistant:

void fits_setup_shape ( RgnShape *newShape)
{
/* Perform some useful calculations now to speed up filter later             */

  double X, Y, R;
  double *coords;
  int i;

  if ( newShape->shape == poly_rgn ) {
    coords = newShape->param.poly.Pts;
  } else {
    coords = newShape->param.gen.p;
  }

  switch( newShape->shape ) {
  case circle_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    break;
  case annulus_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    newShape->param.gen.b = coords[3] * coords[3];
    break;
  case sector_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    break;
  case ellipse_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case elliptannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case box_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case boxannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case rectangle_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    X = 0.5 * ( coords[2]-coords[0] );
    Y = 0.5 * ( coords[3]-coords[1] );
    newShape->param.gen.a = fabs( X * newShape->param.gen.cosT
				  + Y * newShape->param.gen.sinT );
    newShape->param.gen.b = fabs( Y * newShape->param.gen.cosT
				  - X * newShape->param.gen.sinT );
    newShape->param.gen.p[5] = 0.5 * ( coords[2]+coords[0] );
    newShape->param.gen.p[6] = 0.5 * ( coords[3]+coords[1] );
    break;
  case diamond_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case line_rgn:
    X = coords[2] - coords[0];
    Y = coords[3] - coords[1];
    R = sqrt( X*X + Y*Y );
    newShape->param.gen.sinT = ( R ? Y/R : 0.0 );
    newShape->param.gen.cosT = ( R ? X/R : 1.0 );
    newShape->param.gen.a    = R + 0.5;
    break;
  case panda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.a = newShape->param.gen.p[5]*newShape->param.gen.p[5];
    newShape->param.gen.b = newShape->param.gen.p[6]*newShape->param.gen.p[6];
    break;
  case epanda_rgn:
  case bpanda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.sinT = sin( myPI * (coords[10] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[10] / 180.0) );
    break;
  default:
    break;
  }

  /*  Set the xmin, xmax, ymin, ymax elements of the RgnShape structure */

  /* For everything which has first two parameters as center position just */
  /* find a circle that encompasses the region and use it to set the       */
  /* bounding box                                                          */

  R = -1.0;

  switch ( newShape->shape ) {

  case circle_rgn:
    R = coords[2];
    break;

  case annulus_rgn:
    R = coords[3];
    break;

  case ellipse_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2];
    } else {
      R = coords[3];
    }
    break;

  case elliptannulus_rgn:
    if ( coords[4] > coords[5] ) {
      R = coords[4];
    } else {
      R = coords[5];
    }
    break;

  case box_rgn:
    R = sqrt(coords[2]*coords[2]+
	     coords[3]*coords[3])/2.0;
    break;

  case boxannulus_rgn:
    R = sqrt(coords[4]*coords[5]+
	     coords[4]*coords[5])/2.0;
    break;

  case diamond_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2]/2.0;
    } else {
      R = coords[3]/2.0;
    }
    break;
    
  case point_rgn:
    R = 1.0;
    break;

  case panda_rgn:
    R = coords[6];
    break;

  case epanda_rgn:
    if ( coords[7] > coords[8] ) {
      R = coords[7];
    } else {
      R = coords[8];
    }
    break;

  case bpanda_rgn:
    R = sqrt(coords[7]*coords[8]+
	     coords[7]*coords[8])/2.0;
    break;

  default:
    break;
  }

  if ( R > 0.0 ) {

    newShape->xmin = coords[0] - R;
    newShape->xmax = coords[0] + R;
    newShape->ymin = coords[1] - R;
    newShape->ymax = coords[1] + R;

    return;

  }

  /* Now do the rest of the shapes that require individual methods */

  switch ( newShape->shape ) {

  case rectangle_rgn:
    R = sqrt((coords[5]-coords[0])*(coords[5]-coords[0])+
	     (coords[6]-coords[1])*(coords[6]-coords[1]));
    newShape->xmin = coords[5] - R;
    newShape->xmax = coords[5] + R;
    newShape->ymin = coords[6] - R;
    newShape->ymax = coords[6] + R;
    break;

  case poly_rgn:
    newShape->xmin = coords[0];
    newShape->xmax = coords[0];
    newShape->ymin = coords[1];
    newShape->ymax = coords[1];
    for( i=2; i < newShape->param.poly.nPts; ) {
      if( newShape->xmin > coords[i] ) /* Min X */
	newShape->xmin = coords[i];
      if( newShape->xmax < coords[i] ) /* Max X */
	newShape->xmax = coords[i];
      i++;
      if( newShape->ymin > coords[i] ) /* Min Y */
	newShape->ymin = coords[i];
      if( newShape->ymax < coords[i] ) /* Max Y */
	newShape->ymax = coords[i];
      i++;
    }
    break;

  case line_rgn:
    if ( coords[0] > coords[2] ) {
      newShape->xmin = coords[2];
      newShape->xmax = coords[0];
    } else {
      newShape->xmin = coords[0];
      newShape->xmax = coords[2];
    }
    if ( coords[1] > coords[3] ) {
      newShape->ymin = coords[3];
      newShape->ymax = coords[1];
    } else {
      newShape->ymin = coords[1];
      newShape->ymax = coords[3];
    }

    break;

    /* sector doesn't have min and max so indicate by setting max < min */

  case sector_rgn:
    newShape->xmin = 1.0;
    newShape->xmax = -1.0;
    newShape->ymin = 1.0;
    newShape->ymax = -1.0;
    break;

  default:
    break;
  }

  return;

}